

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateSendCommand(HelicsFederate fed,char *target,char *command,HelicsError *err)

{
  string_view commandStr;
  string_view target_00;
  Federate *pFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RSI;
  __sv_type _Var2;
  Federate *fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  HelicsError *in_stack_ffffffffffffff38;
  HelicsFederate in_stack_ffffffffffffff40;
  bool local_a2;
  allocator<char> local_a1;
  allocator<char> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  HelicsSequencingModes in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98 [14];
  byte bVar3;
  allocator<char> in_stack_ffffffffffffffa7;
  
  pFVar1 = getFed(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (pFVar1 != (Federate *)0x0) {
    bVar3 = 0;
    if (in_RSI == 0) {
      std::__cxx11::string::string(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    else {
      std::allocator<char>::allocator();
      bVar3 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60);
    }
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
    local_a2 = in_RDX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_a2) {
      std::__cxx11::string::string(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff30 = in_RDX;
    }
    local_a2 = !local_a2;
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
    target_00._M_str._6_1_ = bVar3;
    target_00._0_14_ = in_stack_ffffffffffffff98;
    target_00._M_str._7_1_ = in_stack_ffffffffffffffa7;
    commandStr._M_str = in_stack_ffffffffffffff90;
    commandStr._M_len = (size_t)_Var2._M_str;
    helics::Federate::sendCommand
              ((Federate *)_Var2._M_len,target_00,commandStr,in_stack_ffffffffffffff7c);
    std::__cxx11::string::~string(in_stack_ffffffffffffff30);
    if (local_a2) {
      std::allocator<char>::~allocator(&local_a1);
    }
    std::__cxx11::string::~string(in_stack_ffffffffffffff30);
    if ((bVar3 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
    }
  }
  return;
}

Assistant:

void helicsFederateSendCommand(HelicsFederate fed, const char* target, const char* command, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    fedObj->sendCommand(AS_STRING(target), AS_STRING(command));
}